

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfreelist_p.h
# Opt level: O0

int __thiscall
QFreeList<void,_QtTimerIdFreeListConstants>::next(QFreeList<void,_QtTimerIdFreeListConstants> *this)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint offset;
  Type pQVar4;
  QBasicAtomicPointer<QFreeListElement<void>_> *pQVar5;
  long in_FS_OFFSET;
  int block;
  ElementType *v;
  int newid;
  int id;
  int at;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QBasicAtomicPointer<QFreeListElement<void>_> *in_stack_ffffffffffffffc0;
  int in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    uVar3 = QBasicAtomicInteger<int>::loadAcquire((QBasicAtomicInteger<int> *)0x32976a);
    offset = uVar3 & 0xffffff;
    blockfor((int *)&stack0xfffffffffffffff4);
    pQVar4 = QBasicAtomicPointer<QFreeListElement<void>_>::loadAcquire
                       ((QBasicAtomicPointer<QFreeListElement<void>_> *)0x32979f);
    if (pQVar4 == (Type)0x0) {
      pQVar5 = (QBasicAtomicPointer<QFreeListElement<void>_> *)
               allocate(offset,in_stack_fffffffffffffff0);
      bVar2 = QBasicAtomicPointer<QFreeListElement<void>_>::testAndSetRelease
                        (in_stack_ffffffffffffffc0,
                         (Type)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         (Type)0x3297f6);
      if (!bVar2) {
        if (pQVar5 != (QBasicAtomicPointer<QFreeListElement<void>_> *)0x0) {
          operator_delete__(pQVar5);
        }
        QBasicAtomicPointer<QFreeListElement<void>_>::loadAcquire
                  ((QBasicAtomicPointer<QFreeListElement<void>_> *)0x32982a);
        in_stack_ffffffffffffffc0 = pQVar5;
      }
    }
    QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x329847);
    bVar2 = QBasicAtomicInteger<int>::testAndSetRelease
                      ((QBasicAtomicInteger<int> *)in_stack_ffffffffffffffc0,
                       in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  } while (((bVar2 ^ 0xffU) & 1) != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

inline int QFreeList<T, ConstantsType>::next()
{
    int id, newid, at;
    ElementType *v;
    do {
        id = _next.loadAcquire();

        at = id & ConstantsType::IndexMask;
        const int block = blockfor(at);
        v = _v[block].loadAcquire();

        if (!v) {
            v = allocate((id & ConstantsType::IndexMask) - at, ConstantsType::Sizes[block]);
            if (!_v[block].testAndSetRelease(nullptr, v)) {
                // race with another thread lost
                delete[] v;
                v = _v[block].loadAcquire();
                Q_ASSERT(v != nullptr);
            }
        }

        newid = v[at].next.loadRelaxed() | (id & ~ConstantsType::IndexMask);
    } while (!_next.testAndSetRelease(id, newid));
    // qDebug("QFreeList::next(): returning %d (_next now %d, serial %d)",
    //        id & ConstantsType::IndexMask,
    //        newid & ConstantsType::IndexMask,
    //        (newid & ~ConstantsType::IndexMask) >> 24);
    return id;
}